

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_long,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_4UL>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  char c;
  array<unsigned_long,_4UL> value;
  char local_79;
  undefined1 local_78 [40];
  array<unsigned_long,_4UL> local_50;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    if (bVar2) {
      local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
      local_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_78._16_8_ = 0;
      local_78._24_8_ = 0;
      local_78._32_8_ = 0;
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
                  *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
    }
    else {
      bVar2 = ParseBasicTypeTuple<unsigned_long,4ul>(this,&local_50);
      if (bVar2) {
        local_78[0] = 1;
        local_78._8_8_ = local_50._M_elems[0];
        local_78._16_8_ = local_50._M_elems[1];
        local_78._24_8_ = local_50._M_elems[2];
        local_78._32_8_ = local_50._M_elems[3];
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
        ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
                  ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
                    *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
      }
      else {
        local_78._0_8_ = local_78 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"Not starting with the tuple value of requested type.\n","");
        PushError(this,(string *)local_78);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
      }
      if (!bVar2) {
        return false;
      }
    }
    do {
      pSVar1 = this->_sr;
      if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
      goto LAB_0038ef3f;
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_79);
      iVar4 = 1;
      if (bVar2) {
        if (local_79 == sep) {
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (bVar2) {
            bVar2 = MaybeNone(this);
            if (bVar2) {
              local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
              local_78._24_8_ = 0;
              local_78._32_8_ = 0;
              local_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
              local_78._16_8_ = 0;
              ::std::
              vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
                          *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
            }
            else {
              bVar2 = ParseBasicTypeTuple<unsigned_long,4ul>(this,&local_50);
              iVar4 = 3;
              if (!bVar2) goto LAB_0038ef30;
              local_78[0] = 1;
              local_78._24_8_ = local_50._M_elems[2];
              local_78._32_8_ = local_50._M_elems[3];
              local_78._8_8_ = local_50._M_elems[0];
              local_78._16_8_ = local_50._M_elems[1];
              ::std::
              vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
                          *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
            }
            iVar4 = 0;
          }
        }
        else {
          pSVar1 = this->_sr;
          iVar4 = 3;
          if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
            pSVar1->idx_ = uVar3;
          }
        }
      }
LAB_0038ef30:
    } while (iVar4 == 0);
    if (iVar4 != 1) {
LAB_0038ef3f:
      if (*(long *)result != *(long *)(result + 8)) {
        return true;
      }
      local_78._0_8_ = local_78 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Empty array.\n","");
      PushError(this,(string *)local_78);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}